

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

bool __thiscall ON_SubDMeshFragmentIterator::IsEmpty(ON_SubDMeshFragmentIterator *this)

{
  element_type *peVar1;
  ON_SubDMeshFragment *pOVar2;
  ON_SubDFaceIterator local_fit;
  ON_SubDFaceIterator OStack_48;
  
  if (this->m_bFromFaceFragments == true) {
    ON_SubDFaceIterator::ON_SubDFaceIterator(&OStack_48,&this->m_fit);
    OStack_48.m_face_index = 0;
    OStack_48.m_face_current = OStack_48.m_face_first;
    while ((pOVar2 = (ON_SubDMeshFragment *)0x0, OStack_48.m_face_first != (ON_SubDFace *)0x0 &&
           (pOVar2 = ON_SubDFace::MeshFragments(OStack_48.m_face_first),
           pOVar2 == (ON_SubDMeshFragment *)0x0))) {
      OStack_48.m_face_first = ON_SubDFaceIterator::NextFace(&OStack_48);
    }
    ON_SubDRef::~ON_SubDRef(&OStack_48.m_subd_ref);
  }
  else {
    peVar1 = (this->m_limit_mesh).m_impl_sp.
             super___shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      pOVar2 = (ON_SubDMeshFragment *)0x0;
    }
    else {
      pOVar2 = peVar1->m_first_fragment;
    }
  }
  return pOVar2 == (ON_SubDMeshFragment *)0x0;
}

Assistant:

bool ON_SubDMeshFragmentIterator::IsEmpty() const
{
  const ON_SubDMeshFragment* f0 = nullptr;
  if (m_bFromFaceFragments)
  {
    ON_SubDFaceIterator local_fit(m_fit); // cannot modify fit
    for (const ON_SubDFace* f = local_fit.FirstFace(); nullptr != f; f = local_fit.NextFace())
    {
      f0 = f->MeshFragments();
      if (nullptr != f0)
        break;
    }
  }
  else
  {
    f0 = m_limit_mesh.FirstFragment();
  }
  return (nullptr == f0);
}